

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractscrollarea.cpp
# Opt level: O3

void __thiscall
QAbstractScrollArea::setVerticalScrollBarPolicy(QAbstractScrollArea *this,ScrollBarPolicy policy)

{
  ScrollBarPolicy SVar1;
  QAbstractScrollAreaPrivate *this_00;
  
  this_00 = *(QAbstractScrollAreaPrivate **)(this + 8);
  SVar1 = this_00->vbarpolicy;
  this_00->vbarpolicy = policy;
  if ((*(byte *)(*(long *)(this + 0x20) + 9) & 0x80) != 0) {
    QAbstractScrollAreaPrivate::layoutChildren(this_00);
    policy = this_00->vbarpolicy;
  }
  if (SVar1 == policy) {
    return;
  }
  (**(code **)(*(long *)&(this_00->super_QFramePrivate).super_QWidgetPrivate + 0xa8))(this_00,2);
  return;
}

Assistant:

void QAbstractScrollArea::setVerticalScrollBarPolicy(Qt::ScrollBarPolicy policy)
{
    Q_D(QAbstractScrollArea);
    const Qt::ScrollBarPolicy oldPolicy = d->vbarpolicy;
    d->vbarpolicy = policy;
    if (isVisible())
        d->layoutChildren();
    if (oldPolicy != d->vbarpolicy)
        d->scrollBarPolicyChanged(Qt::Vertical, d->vbarpolicy);
}